

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void maxPoolingInit(pBox *pbox,pBox *Matrix,int kernelSize,int stride,int flag)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  mydataFmt *__s;
  size_t __size;
  float __x;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float local_38;
  
  fVar6 = (float)stride;
  uVar1 = pbox->width;
  uVar2 = pbox->height;
  auVar4._0_4_ = (float)(uVar1 - kernelSize);
  auVar4._4_4_ = (float)(uVar2 - kernelSize);
  auVar4._8_8_ = 0;
  auVar5._4_4_ = fVar6;
  auVar5._0_4_ = fVar6;
  auVar5._8_4_ = fVar6;
  auVar5._12_4_ = fVar6;
  auVar5 = divps(auVar4,auVar5);
  fVar6 = auVar5._0_4_ + 1.0;
  __x = auVar5._4_4_ + 1.0;
  if (flag == 1) {
    local_38 = floorf(fVar6);
    fVar6 = floorf(__x);
  }
  else {
    local_38 = ceilf(fVar6);
    fVar6 = ceilf(__x);
  }
  Matrix->width = (int)local_38;
  Matrix->height = (int)fVar6;
  iVar3 = pbox->channel;
  Matrix->channel = iVar3;
  __size = (long)((int)fVar6 * (int)local_38 * iVar3) << 2;
  __s = (mydataFmt *)malloc(__size);
  Matrix->pdata = __s;
  if (__s == (mydataFmt *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the maxPoolingI nit is failed!!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    __s = Matrix->pdata;
    __size = (long)Matrix->height * (long)Matrix->width * (long)Matrix->channel * 4;
  }
  memset(__s,0,__size);
  return;
}

Assistant:

void maxPoolingInit(const pBox *pbox, pBox *Matrix, int kernelSize, int stride, int flag) {
    if (flag == 1) {
        Matrix->width = floor((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = floor((float) (pbox->height - kernelSize) / stride + 1);
    } else {
        Matrix->width = ceil((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = ceil((float) (pbox->height - kernelSize) / stride + 1);
    }
    Matrix->channel = pbox->channel;
    Matrix->pdata = (mydataFmt *) malloc(Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
    if (Matrix->pdata == NULL)cout << "the maxPoolingI nit is failed!!" << endl;
    memset(Matrix->pdata, 0, Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
}